

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O0

p_rank * __thiscall dna_string::parallel_rank(dna_string *this,uint64_t i)

{
  ulong __n;
  reference pvVar1;
  ulong in_RDX;
  dna_string *in_RSI;
  p_rank *in_RDI;
  dna_string *unaff_retaddr;
  p_rank block_r;
  p_rank superblock_r;
  uint64_t block_off;
  uint64_t block_number;
  uint64_t superblock_off;
  uint64_t superblock_number;
  p_rank local_b0;
  p_rank local_90;
  p_rank local_70;
  p_rank local_50;
  ulong local_30;
  uint64_t local_28;
  ulong local_20;
  dna_string *superblock_number_00;
  
  __n = in_RDX >> 0x20;
  local_20 = in_RDX & 0xffffffff;
  local_28 = local_20 >> 7;
  local_30 = in_RDX & 0x7f;
  superblock_number_00 = in_RSI;
  pvVar1 = std::vector<p_rank,_std::allocator<p_rank>_>::operator[](&in_RSI->superblock_ranks,__n);
  local_50.A = pvVar1->A;
  local_50.C = pvVar1->C;
  local_50.G = pvVar1->G;
  local_50.T = pvVar1->T;
  get_counters(&local_70,in_RSI,__n,local_28);
  p_rank::operator+(&local_90,&local_50,&local_70);
  block_rank(unaff_retaddr,(uint64_t)superblock_number_00,in_RDX,__n);
  p_rank::operator+(in_RDI,&local_90,&local_b0);
  return in_RDI;
}

Assistant:

p_rank parallel_rank(uint64_t i){

		uint64_t superblock_number = i / SUPERBLOCK_SIZE;
		uint64_t superblock_off = i % SUPERBLOCK_SIZE;
		uint64_t block_number = superblock_off / BLOCK_SIZE;
		uint64_t block_off = superblock_off % BLOCK_SIZE;

		p_rank superblock_r = superblock_ranks[superblock_number];
		p_rank block_r = get_counters(superblock_number,block_number);

		return superblock_r + block_r + block_rank(superblock_number, block_number, block_off);

	}